

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

void __thiscall
icu_63::LocaleDisplayNamesImpl::LocaleDisplayNamesImpl
          (LocaleDisplayNamesImpl *this,Locale *locale,UDisplayContext *contexts,int32_t length)

{
  UDialectHandling UVar1;
  uint uVar2;
  int iVar3;
  UDialectHandling *pUVar4;
  UDisplayContextType selector;
  UDisplayContext value;
  int local_24;
  UDialectHandling *pUStack_20;
  int32_t length_local;
  UDisplayContext *contexts_local;
  Locale *locale_local;
  LocaleDisplayNamesImpl *this_local;
  
  LocaleDisplayNames::LocaleDisplayNames(&this->super_LocaleDisplayNames);
  (this->super_LocaleDisplayNames).super_UObject._vptr_UObject =
       (_func_int **)&PTR__LocaleDisplayNamesImpl_004a1b98;
  Locale::Locale(&this->locale);
  this->dialectHandling = ULDN_STANDARD_NAMES;
  ICUDataTable::ICUDataTable(&this->langData,"icudt63l-lang",locale);
  ICUDataTable::ICUDataTable(&this->regionData,"icudt63l-region",locale);
  SimpleFormatter::SimpleFormatter(&this->separatorFormat);
  SimpleFormatter::SimpleFormatter(&this->format);
  SimpleFormatter::SimpleFormatter(&this->keyTypeFormat);
  this->capitalizationContext = UDISPCTX_CAPITALIZATION_NONE;
  this->capitalizationBrkIter = (BreakIterator *)0x0;
  UnicodeString::UnicodeString(&this->formatOpenParen);
  UnicodeString::UnicodeString(&this->formatReplaceOpenParen);
  UnicodeString::UnicodeString(&this->formatCloseParen);
  UnicodeString::UnicodeString(&this->formatReplaceCloseParen);
  this->nameLength = UDISPCTX_LENGTH_FULL;
  local_24 = length;
  pUStack_20 = contexts;
  while (iVar3 = local_24 + -1, 0 < local_24) {
    pUVar4 = pUStack_20 + 1;
    UVar1 = *pUStack_20;
    uVar2 = UVar1 >> 8;
    local_24 = iVar3;
    pUStack_20 = pUVar4;
    if (uVar2 == 0) {
      this->dialectHandling = UVar1;
    }
    else if (uVar2 == 1) {
      this->capitalizationContext = UVar1;
    }
    else if (uVar2 == 2) {
      this->nameLength = UVar1;
    }
  }
  initialize(this);
  return;
}

Assistant:

LocaleDisplayNamesImpl::LocaleDisplayNamesImpl(const Locale& locale,
                                               UDisplayContext *contexts, int32_t length)
    : dialectHandling(ULDN_STANDARD_NAMES)
    , langData(U_ICUDATA_LANG, locale)
    , regionData(U_ICUDATA_REGION, locale)
    , capitalizationContext(UDISPCTX_CAPITALIZATION_NONE)
    , capitalizationBrkIter(NULL)
    , nameLength(UDISPCTX_LENGTH_FULL)
{
    while (length-- > 0) {
        UDisplayContext value = *contexts++;
        UDisplayContextType selector = (UDisplayContextType)((uint32_t)value >> 8);
        switch (selector) {
            case UDISPCTX_TYPE_DIALECT_HANDLING:
                dialectHandling = (UDialectHandling)value;
                break;
            case UDISPCTX_TYPE_CAPITALIZATION:
                capitalizationContext = value;
                break;
            case UDISPCTX_TYPE_DISPLAY_LENGTH:
                nameLength = value;
                break;
            default:
                break;
        }
    }
    initialize();
}